

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O2

void float_invalid_op_div(CPUPPCState_conflict *env,_Bool set_fprc,uintptr_t retaddr,int classes)

{
  byte *pbVar1;
  int iStack_8;
  
  if ((classes & 0xffffffbfU) == 2) {
    pbVar1 = (byte *)((long)&env->fpscr + 2);
    *pbVar1 = *pbVar1 | 0x20;
    iStack_8 = 8;
  }
  else {
    if ((classes & 0xffffffbfU) != 8) {
      if ((classes & 0x20U) == 0) {
        return;
      }
      float_invalid_op_vxsnan(env,retaddr);
      return;
    }
    pbVar1 = (byte *)((long)&env->fpscr + 2);
    *pbVar1 = *pbVar1 | 0x40;
    iStack_8 = 7;
  }
  finish_invalid_op_arith(env,iStack_8,set_fprc,retaddr);
  return;
}

Assistant:

static void float_invalid_op_div(CPUPPCState *env, bool set_fprc,
                                 uintptr_t retaddr, int classes)
{
    classes &= ~is_neg;
    if (classes == is_inf) {
        /* Division of infinity by infinity */
        float_invalid_op_vxidi(env, set_fprc, retaddr);
    } else if (classes == is_zero) {
        /* Division of zero by zero */
        float_invalid_op_vxzdz(env, set_fprc, retaddr);
    } else if (classes & is_snan) {
        float_invalid_op_vxsnan(env, retaddr);
    }
}